

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipcommunication.c
# Opt level: O0

int ipcmd_open_tcp(ipcmd_t *ipcmd,char *host,int port)

{
  int iVar1;
  int local_38;
  undefined1 local_34 [4];
  int i;
  sockaddr_in addr;
  int port_local;
  char *host_local;
  ipcmd_t *ipcmd_local;
  
  ipcmd->send = ipcmd_send;
  ipcmd->recv = ipcmd_recv;
  ipcmd->flush = ipcmd_flush;
  addr.sin_zero._0_4_ = port;
  unique0x100001a6 = host;
  memset(local_34,0,0x10);
  local_34._2_2_ = htons(addr.sin_zero._0_2_);
  local_34._0_2_ = 2;
  iVar1 = socket(2,1,0);
  ipcmd->socket = iVar1;
  for (local_38 = 0; local_38 < 0x40; local_38 = local_38 + 1) {
    ipcmd->clients[local_38] = -1;
  }
  if (stack0xffffffffffffffe0 == (char *)0x0) {
    i = htonl(0);
    bind(ipcmd->socket,(sockaddr *)local_34,0x10);
    listen(ipcmd->socket,0x40);
    ipcmd->tcp_type = IPCMD_TCP_SERVER;
  }
  else {
    i = inet_addr(stack0xffffffffffffffe0);
    iVar1 = connect(ipcmd->socket,(sockaddr *)local_34,0x10);
    if (iVar1 == -1) {
      return -1;
    }
    ipcmd->tcp_type = IPCMD_TCP_CLIENT;
  }
  ipcmd->type = IPCMD_TCP;
  ipcmd->send = ipcmd_send_tcp;
  ipcmd->recv = ipcmd_recv_tcp;
  ipcmd->flush = ipcmd_flush_tcp;
  ipcmd->connection_error = 0;
  return 1;
}

Assistant:

int ipcmd_open_tcp(struct ipcmd_t* ipcmd, char* host, int port)
{
  struct sockaddr_in addr;
  int i;

#if HAVE_LIBWS2_32
  WSADATA wsadata;

  if (WSAStartup(MAKEWORD(2, 2), &wsadata) != 0)
  {
    return -1;
  }
#endif  // HAVE_LIBWS2_32

  ipcmd->send = ipcmd_send;
  ipcmd->recv = ipcmd_recv;
  ipcmd->flush = ipcmd_flush;
  memset(&addr, 0, sizeof(addr));
  addr.sin_port = htons(port);
  addr.sin_family = AF_INET;

  ipcmd->socket = socket(AF_INET, SOCK_STREAM, 0);
  for (i = 0; i < YPSPUR_MAX_SOCKET; i++)
  {
    ipcmd->clients[i] = -1;
  }

  if (!host)
  {
    addr.sin_addr.s_addr = htonl(INADDR_ANY);
    bind(ipcmd->socket, (struct sockaddr*)&addr, sizeof(addr));

    listen(ipcmd->socket, YPSPUR_MAX_SOCKET);
    ipcmd->tcp_type = IPCMD_TCP_SERVER;
  }
  else
  {
    addr.sin_addr.s_addr = inet_addr(host);

    if (connect(ipcmd->socket, (struct sockaddr*)&addr, sizeof(addr)) == -1)
    {
      return -1;
    }
    ipcmd->tcp_type = IPCMD_TCP_CLIENT;
  }

  ipcmd->type = IPCMD_TCP;
  ipcmd->send = ipcmd_send_tcp;
  ipcmd->recv = ipcmd_recv_tcp;
  ipcmd->flush = ipcmd_flush_tcp;

  ipcmd->connection_error = 0;

  return 1;
}